

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall GrcManager::DebugGlyphAttributes(GrcManager *this,char *pchOutputPath)

{
  GrcSymbolTable *pGVar1;
  pointer ppGVar2;
  GrcSymbolTableEntry *__lhs;
  __type _Var3;
  uint uVar4;
  Symbol pGVar5;
  ostream *poVar6;
  ofstream *poVar7;
  size_t sVar8;
  size_t ipass;
  ulong uVar9;
  GrcManager *this_00;
  uint nAttrID;
  bool bVar10;
  allocator local_3a9;
  uint local_3a8;
  allocator local_3a1;
  GrcManager *local_3a0;
  uint local_398;
  int local_394;
  int local_390;
  uint local_38c;
  size_t local_388;
  ulong local_380;
  string local_378;
  ulong local_358;
  string staOutputFilename;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream strmOut;
  byte abStack_210 [480];
  
  std::__cxx11::string::string((string *)&staOutputFilename,pchOutputPath,(allocator *)&strmOut);
  std::__cxx11::string::append((char *)&staOutputFilename);
  std::ofstream::ofstream(&strmOut);
  std::ofstream::open((char *)&strmOut,(_Ios_Openmode)staOutputFilename._M_dataplus._M_p);
  if ((abStack_210[*(long *)(_strmOut + -0x18)] & 5) == 0) {
    pGVar1 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_2b0,"breakweight",(allocator *)&local_378);
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    local_390 = pGVar5->m_nInternalID;
    pGVar1 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_2d0,"*skipPasses*",(allocator *)&local_378);
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    local_38c = pGVar5->m_nInternalID;
    pGVar1 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_2f0,"*skipPasses2*",(allocator *)&local_378);
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    if (pGVar5 == (Symbol)0x0) {
      local_3a8 = 0;
    }
    else {
      local_3a8 = pGVar5->m_nInternalID;
    }
    local_388 = GdlRenderer::NumberOfPasses(this->m_prndr);
    pGVar1 = this->m_psymtbl;
    std::__cxx11::string::string((string *)&local_310,"justify",&local_3a9);
    std::__cxx11::string::string((string *)&local_330,"stretch",&local_3a1);
    GrcStructName::GrcStructName((GrcStructName *)&local_378,&local_310,&local_330);
    pGVar5 = GrcSymbolTable::FindSymbol(pGVar1,(GrcStructName *)&local_378);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_378);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_310);
    if (g_errorList.m_fFatalError == true) {
      std::operator<<((ostream *)&strmOut,"Fatal errors--compilation aborted");
    }
    else {
      local_394 = pGVar5->m_nInternalID;
      std::operator<<((ostream *)&strmOut,"GLYPH ATTRIBUTE IDS\n\n");
      local_3a0 = this;
      for (uVar9 = 0;
          ppGVar2 = (local_3a0->m_vpsymGlyphAttrs).
                    super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(local_3a0->m_vpsymGlyphAttrs).
                                super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3);
          uVar9 = uVar9 + 1) {
        if ((int)uVar9 == ppGVar2[uVar9]->m_nInternalID) {
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&strmOut);
          poVar6 = std::operator<<(poVar6,": ");
          GrcSymbolTableEntry::FullName_abi_cxx11_
                    (&local_378,
                     (local_3a0->m_vpsymGlyphAttrs).
                     super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9]);
          poVar6 = std::operator<<(poVar6,(string *)&local_378);
          std::operator<<(poVar6,"\n");
          std::__cxx11::string::~string((string *)&local_378);
        }
      }
      std::operator<<((ostream *)&strmOut,"\n\n\nGLYPH ATTRIBUTE VALUES\n\n");
      local_358 = 0x10;
      if (local_388 < 0x10) {
        local_358 = local_388;
      }
      uVar4 = 0;
      this_00 = local_3a0;
      while ((ulong)uVar4 < this_00->m_cwGlyphIDs) {
        ConvertBwForVersion(this_00,(gid16)uVar4,local_390);
        local_398 = uVar4 & 0xffff;
        SplitLargeStretchValue(this_00,(gid16)uVar4,local_394);
        bVar10 = false;
        local_380 = (ulong)uVar4;
        for (nAttrID = 0; uVar9 = (ulong)nAttrID,
            uVar9 < (ulong)((long)(this_00->m_vpsymGlyphAttrs).
                                  super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->m_vpsymGlyphAttrs).
                                  super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
            nAttrID = nAttrID + 1) {
          uVar4 = FinalAttrValue(this_00,(gid16)local_398,nAttrID);
          if (uVar4 != 0) {
            if (!bVar10) {
              poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&strmOut);
              std::operator<<(poVar6,"  [");
              DebugHex((ostream *)&strmOut,(gid16)local_398);
              std::operator<<((ostream *)&strmOut,"]\n");
            }
            poVar6 = std::operator<<((ostream *)&strmOut,"   ");
            GrcSymbolTableEntry::FullName_abi_cxx11_
                      (&local_378,
                       (local_3a0->m_vpsymGlyphAttrs).
                       super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar9]);
            poVar6 = std::operator<<(poVar6,(string *)&local_378);
            std::operator<<(poVar6," = ");
            std::__cxx11::string::~string((string *)&local_378);
            __lhs = (local_3a0->m_vpsymGlyphAttrs).
                    super__Vector_base<GrcSymbolTableEntry_*,_std::allocator<GrcSymbolTableEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9];
            std::__cxx11::string::string((string *)&local_250,"gpoint",(allocator *)&local_378);
            _Var3 = std::operator==(&__lhs->m_staFieldName,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            if ((uVar4 == 0xfffffffe) && (_Var3)) {
              poVar7 = (ofstream *)std::operator<<((ostream *)&strmOut,"zero");
            }
            else {
              std::ostream::operator<<(&strmOut,uVar4);
              poVar7 = &strmOut;
              if ((nAttrID == local_38c) || (nAttrID == local_3a8)) {
                bVar10 = nAttrID == local_3a8;
                sVar8 = local_358;
                if (bVar10) {
                  sVar8 = local_388;
                }
                std::operator<<((ostream *)&strmOut," [");
                DebugHex((ostream *)&strmOut,(gid16)uVar4);
                std::operator<<((ostream *)&strmOut,"  / ");
                for (uVar9 = (ulong)bVar10 << 4; uVar9 < sVar8; uVar9 = uVar9 + 1) {
                  poVar6 = std::operator<<((ostream *)&strmOut," ");
                  std::ostream::operator<<(poVar6,uVar4 & 1);
                  uVar4 = (int)uVar4 >> 1;
                }
                std::operator<<((ostream *)&strmOut,"]");
              }
              else if (9 < uVar4) {
                std::operator<<((ostream *)&strmOut," [");
                DebugHex((ostream *)&strmOut,(gid16)uVar4);
                std::operator<<((ostream *)&strmOut,"]");
              }
            }
            bVar10 = true;
            std::operator<<((ostream *)poVar7,"\n");
          }
          this_00 = local_3a0;
        }
        if (bVar10) {
          std::operator<<((ostream *)&strmOut,"\n\n");
        }
        uVar4 = (int)local_380 + 1;
      }
    }
    std::ofstream::close();
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_270,"Error in writing to file ",(allocator *)&local_378);
    std::__cxx11::string::string((string *)&local_290,staOutputFilename._M_dataplus._M_p,&local_3a9)
    ;
    GrcErrorList::AddWarning(&g_errorList,0x1967,(GdlObject *)0x0,&local_270,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::ofstream::~ofstream(&strmOut);
  std::__cxx11::string::~string((string *)&staOutputFilename);
  return;
}

Assistant:

void GrcManager::DebugGlyphAttributes(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_glyphattrs.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6503, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	Symbol psymBw = m_psymtbl->FindSymbol("breakweight");
	int nAttrIdBw = psymBw->InternalID();

	Symbol psymSkipP = m_psymtbl->FindSymbol("*skipPasses*");
	int nAttrIdSkipP = psymSkipP->InternalID();
	int nAttrIdSkipP2 = 0;
	Symbol psymSkipP2 = m_psymtbl->FindSymbol("*skipPasses2*");
	if (psymSkipP2)
		nAttrIdSkipP2 = psymSkipP2->InternalID();
	auto cpass = this->m_prndr->NumberOfPasses();

	//Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "0", "stretch"));
	Symbol psymJStr = m_psymtbl->FindSymbol(GrcStructName("justify", "stretch"));
	int nAttrIdJStr = psymJStr->InternalID();

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		strmOut << "GLYPH ATTRIBUTE IDS\n\n";
		for (size_t nAttrID = 0; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
		{
			if (m_vpsymGlyphAttrs[nAttrID]->InternalID() == static_cast<int>(nAttrID))
			{
				strmOut << nAttrID << ": "
					<< m_vpsymGlyphAttrs[nAttrID]->FullName() << "\n";
			}
			// else we have something like justify.stretch which is unused
		}
		strmOut << "\n\n\nGLYPH ATTRIBUTE VALUES\n\n";

		for (auto wGlyphID = 0U; wGlyphID < m_cwGlyphIDs; wGlyphID++)
		{
			// Convert breakweight values depending on the table version to output.
			ConvertBwForVersion(wGlyphID, nAttrIdBw);

			//	Split any large stretch values into two 16-bit words.
			SplitLargeStretchValue(wGlyphID, nAttrIdJStr);
		
			bool fAnyNonZero = false;

			for (auto nAttrID = 0U; nAttrID < m_vpsymGlyphAttrs.size(); nAttrID++)
			{
				int nValue = FinalAttrValue(wGlyphID, nAttrID);

				//	Skip undefined and zero-valued attributes.
				if (nValue == 0)
					continue;

				if (fAnyNonZero == false)
				{
					strmOut << wGlyphID << "  [";
					DebugHex(strmOut, wGlyphID);
					strmOut << "]\n";
				}

				fAnyNonZero = true;

				strmOut << "   " << m_vpsymGlyphAttrs[nAttrID]->FullName()
					<< " = ";
				if (m_vpsymGlyphAttrs[nAttrID]->LastFieldIs("gpoint") &&
					nValue == kGpointZero)
				{
					strmOut << "zero" << "\n";
				}
				else
				{
					strmOut  << nValue;
					if (nAttrID == nAttrIdSkipP || nAttrID == nAttrIdSkipP2)
					{
						size_t iStart = 0, 
							   iStop = cpass;
						if (cpass > kPassPerSPbitmap)
							iStop = kPassPerSPbitmap;
						if (nAttrID == nAttrIdSkipP2)
						{
							iStart = kPassPerSPbitmap;
							iStop = cpass;
						}

						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "  / ";
						// Print out bits in order of passes (low to high).
						int tValue = nValue;
						for (auto ipass = iStart; ipass < iStop; ++ipass)
						{
							int n = int((tValue & 0x0001) != 0);
							strmOut << " " << n;
							tValue = tValue >> 1;
						}
						strmOut << "]";
					}
					else if (nValue > 9 || nValue < 0)
					{
						strmOut << " [";
						DebugHex(strmOut, nValue);
						strmOut << "]";
					}
					strmOut << "\n";
				}
			}

			if (fAnyNonZero)
				strmOut << "\n\n";
		}
	}

	strmOut.close();
}